

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

void Aig_ManDfsReverse_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  void **ppvVar3;
  int iVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  uint uVar6;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b4,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (pObj->TravId == p->nTravIds) {
    return;
  }
  uVar2 = *(uint *)&pObj->field_0x18 & 7;
  if ((uVar2 != 4) && (1 < uVar2 - 5)) {
    __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b7,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1b8,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) != 0) {
    uVar2 = 0xffffffff;
    uVar6 = 0;
    do {
      if (uVar6 == 0) {
        if (p->nFansAlloc <= pObj->Id) {
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar4 = pObj->Id * 5;
      }
      else {
        if (p->nFansAlloc <= (int)uVar2 / 2) {
          __assert_fail("iFan/2 < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
        }
        iVar4 = ((int)uVar2 >> 1) * 5 + (uVar2 & 1) + 3;
      }
      pVVar1 = p->vObjs;
      uVar2 = p->pFanData[iVar4];
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pObj_00 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar5 = (int)uVar2 >> 1;
        if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pObj_00 = (Aig_Obj_t *)pVVar1->pArray[uVar5];
      }
      Aig_ManDfsReverse_rec(p,pObj_00,vNodes);
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)&pObj->field_0x18 >> 6);
  }
  if (pObj->TravId == p->nTravIds) {
    __assert_fail("!Aig_ObjIsTravIdCurrent(p, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                  ,0x1ba,"void Aig_ManDfsReverse_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  pObj->TravId = p->nTravIds;
  uVar2 = vNodes->nCap;
  if (vNodes->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar3;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar2 * 2;
      if (iVar4 <= (int)uVar2) goto LAB_00624b4f;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
      }
      vNodes->pArray = ppvVar3;
    }
    vNodes->nCap = iVar4;
  }
LAB_00624b4f:
  iVar4 = vNodes->nSize;
  vNodes->nSize = iVar4 + 1;
  vNodes->pArray[iVar4] = pObj;
  return;
}

Assistant:

void Aig_ManDfsReverse_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    assert( !Aig_IsComplement(pObj) );
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Aig_ManDfsReverse_rec( p, pFanout, vNodes );
    assert( !Aig_ObjIsTravIdCurrent(p, pObj) ); // loop detection
    Aig_ObjSetTravIdCurrent(p, pObj);
    Vec_PtrPush( vNodes, pObj );
}